

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

bool __thiscall psy::C::Parser::ignoreDeclarator(Parser *this)

{
  SyntaxKind SVar1;
  uint uVar2;
  SyntaxToken *pSVar3;
  
  uVar2 = this->curTkIdx_;
  do {
    pSVar3 = SyntaxTree::tokenAt(this->tree_,(ulong)uVar2);
    SVar1 = pSVar3->syntaxK_;
    if (SVar1 < SemicolonToken) {
      if (SVar1 == EndOfFile) {
        return false;
      }
      if (SVar1 == IdentifierToken) {
        return false;
      }
      if (SVar1 == CloseBraceToken) goto LAB_002b2b77;
    }
    else {
      if (SVar1 == CommaToken) {
        return false;
      }
      if (SVar1 == AsteriskToken) {
        return false;
      }
      if (SVar1 == SemicolonToken) {
LAB_002b2b77:
        this->curTkIdx_ = this->curTkIdx_ + 1;
        return false;
      }
    }
    uVar2 = this->curTkIdx_ + 1;
    this->curTkIdx_ = uVar2;
  } while( true );
}

Assistant:

bool Parser::ignoreDeclarator()
{
    while (true) {
        switch (peek().kind()) {
            // Just return.
            case SyntaxKind::EndOfFile:
            case SyntaxKind::CommaToken:
            case SyntaxKind::IdentifierToken:
            case SyntaxKind::AsteriskToken:
                return false;

            // Skip and return.
            case SyntaxKind::SemicolonToken:
            case SyntaxKind::CloseBraceToken:
                consume();
                return false;

            // Skip.
            default:
                consume();
        }
    }
}